

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::setMimeTypeFilters(QFileDialog *this,QStringList *filters)

{
  bool bVar1;
  const_iterator o;
  QString *mimeType_00;
  QFileDialogOptions *pQVar2;
  QStringList *in_RSI;
  QFileDialog *in_RDI;
  long in_FS_OFFSET;
  QString *mimeType;
  QStringList *__range1;
  QFileDialogPrivate *d;
  QString text;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList nameFilters;
  parameter_type in_stack_ffffffffffffff78;
  QFileDialog *this_00;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QFileDialog *)0x7577b5);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x7577e8);
  local_28.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QString>::begin((QList<QString> *)in_RDI);
  o = QList<QString>::end((QList<QString> *)in_RDI);
  while( true ) {
    bVar1 = QList<QString>::const_iterator::operator!=(&local_28,o);
    if (!bVar1) break;
    mimeType_00 = QList<QString>::const_iterator::operator*(&local_28);
    nameFilterForMime(mimeType_00);
    bVar1 = QString::isEmpty((QString *)0x7578b4);
    if (!bVar1) {
      QList<QString>::append((QList<QString> *)in_RDI,in_stack_ffffffffffffff78);
    }
    QString::~QString((QString *)0x7578d1);
    QList<QString>::const_iterator::operator++(&local_28);
  }
  setNameFilters(this_00,in_RSI);
  pQVar2 = QSharedPointer<QFileDialogOptions>::operator->
                     ((QSharedPointer<QFileDialogOptions> *)0x757904);
  QFileDialogOptions::setMimeTypeFilters((QList_conflict2 *)pQVar2);
  QList<QString>::~QList((QList<QString> *)0x75791a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::setMimeTypeFilters(const QStringList &filters)
{
    Q_D(QFileDialog);
    QStringList nameFilters;
    for (const QString &mimeType : filters) {
        const QString text = nameFilterForMime(mimeType);
        if (!text.isEmpty())
            nameFilters.append(text);
    }
    setNameFilters(nameFilters);
    d->options->setMimeTypeFilters(filters);
}